

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

string * __thiscall
phosg::Image::png_data_url_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  string base64_data;
  string png_data;
  
  save_abi_cxx11_(&png_data,this,PNG);
  base64_encode(&base64_data,&png_data,(char *)0x0);
  ::std::operator+(__return_storage_ptr__,"data:image/png;base64,",&base64_data);
  ::std::__cxx11::string::~string((string *)&base64_data);
  ::std::__cxx11::string::~string((string *)&png_data);
  return __return_storage_ptr__;
}

Assistant:

string Image::png_data_url() const {
  string png_data = this->save(Format::PNG);
  string base64_data = base64_encode(png_data);
  return "data:image/png;base64," + base64_data;
}